

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.cpp
# Opt level: O2

CfdError_conflict __thiscall cfd::core::logger::CfdLogger::Initialize(CfdLogger *this)

{
  if (this->is_initialized_ == false) {
    this->is_initialized_ = true;
    this->is_alive_ = true;
  }
  return kCfdSuccess;
}

Assistant:

cfd::core::CfdError cfd::core::logger::CfdLogger::Initialize(void) {
  if (is_initialized_) {
    // do nothing
  } else {
    is_initialized_ = true;
    is_alive_ = true;

    if ((!is_extend_log_) && cfdcore_logger_is_debug) {
#if defined(CFDCORE_LOGGING) && (defined(DEBUG) || defined(CFDCORE_DEBUG))
#ifndef CFDCORE_LOG_CONSOLE
      const size_t kRotateFileSize = 1024 * 1024 * 256;
      const std::string filepath = "cfd_debug.txt";
#endif

      std::string kDefaultLogLevel = "info";
#ifdef CFDCORE_LOG_LEVEL
      int level_val = CFDCORE_LOG_LEVEL;
      if (level_val == 1) {
        kDefaultLogLevel = "trace";
      } else if (level_val == 2) {
        kDefaultLogLevel = "debug";
      } else if (level_val == 4) {
        kDefaultLogLevel = "warn";
      }
#endif

      // TODO(k-matsuzawa): only used for debugging
      auto log_level = StringUtil::ToLower(kDefaultLogLevel);
      if (log_level == "trace") {
        log_level_ = kCfdLogLevelTrace;
      } else if (log_level == "debug") {
        log_level_ = kCfdLogLevelDebug;
      } else if ((log_level == "warn") || (log_level == "warning")) {
        log_level_ = kCfdLogLevelWarning;
      } else {
        log_level_ = kCfdLogLevelInfo;
      }
      // is_async_ = true;

      is_use_default_logger_ = true;
      // spdlog::init_thread_pool(1024 * 128, 5);  // For Initalization
#ifdef CFDCORE_LOG_CONSOLE
      // quill::enable_console_colours();
      quill::ConsoleColours console_colours;
      console_colours.set_default_colours();
      quill::Handler* handler =
          quill::stdout_handler("stdout_colours", console_colours);
      handler->set_pattern(
          QUILL_STRING("%(ascii_time) [%(process):%(thread)] %(level_name) "
                       "%(logger_name) - %(message)"),  // NOLINT
          "%D %H:%M:%S.%Qms", quill::Timezone::LocalTime);
      quill::set_default_logger_handler(handler);
      quill::start();
      quill::Logger* logger = quill::get_logger();
#else
      quill::start();
      quill::Handler* handler =
          quill::rotating_file_handler(filepath, "w", kRotateFileSize, 3);
      handler->set_pattern(
          QUILL_STRING("%(ascii_time) [%(process):%(thread)] %(level_name) "
                       "%(logger_name) - %(message)"),  // NOLINT
          "%D %H:%M:%S.%Qms", quill::Timezone::LocalTime);
      quill::Logger* logger = quill::create_logger("cfd", handler);
#endif
      logger->set_log_level(ConvertLogLevel(log_level_));
      default_logger_ = logger;

#else   // CFDCORE_LOGGING
      std::cout << "default logger is not support on C++11." << std::endl;
#endif  // CFDCORE_LOGGING
    }
  }
  return kCfdSuccess;
}